

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCtrlSystem.cpp
# Opt level: O2

void __thiscall CCtrlSystem::CCtrlSystem(CCtrlSystem *this)

{
  char cVar1;
  uint uVar2;
  CWorker **ppCVar3;
  ostream *poVar4;
  CCtrlSystem *this_00;
  ulong uVar5;
  char ch;
  ifstream ifs;
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(&ifs);
  std::ifstream::open((char *)&ifs,0x1050c2);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"File is not exist! ");
    std::endl<char,std::char_traits<char>>(poVar4);
    this->_isFileEmpty = 1;
    this->_size = 0;
    this->_p_workerArray = (CWorker **)0x0;
    std::ifstream::close();
  }
  else {
    this_00 = (CCtrlSystem *)&ifs;
    std::operator>>((istream *)this_00,&ch);
    if ((abStack_1f8[*(long *)(_ifs + -0x18)] & 2) == 0) {
      uVar2 = getSize(this_00,&ifs);
      this->_isFileEmpty = 0;
      this->_size = uVar2;
      uVar5 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar5 = (ulong)uVar2 << 3;
      }
      ppCVar3 = (CWorker **)operator_new__(uVar5);
      this->_p_workerArray = ppCVar3;
      initArray(this);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"File exist but is empty! ");
      std::endl<char,std::char_traits<char>>(poVar4);
      this->_isFileEmpty = 1;
      this->_size = 0;
      this->_p_workerArray = (CWorker **)0x0;
      std::ifstream::close();
    }
  }
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

CCtrlSystem::CCtrlSystem(/* args */)
{
	ifstream ifs;
	ifs.open(FILENAME, ios::in);
	if (!ifs.is_open())
	{
		cout << "File is not exist! " << endl;
		this->_isFileEmpty = true;
		this->_size = 0;
		this->_p_workerArray = nullptr;
		ifs.close();
		return;

		
	}
	char ch;
	ifs >> ch;
	if (ifs.eof())
	{
		cout << "File exist but is empty! " << endl;
		this->_isFileEmpty = true;
		this->_size = 0;
		this->_p_workerArray = nullptr;
		ifs.close();
		return;
	}
	else
	{
		int size = this->getSize(ifs);
		// cout << "Workers' number is: " << size << endl;
		this->_isFileEmpty = false;
		this->_size = size;
		this->_p_workerArray = new CWorker *[this->_size];
		this->initArray();
	}
}